

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

void __thiscall AddrManImpl::ResolveCollisions_(AddrManImpl *this)

{
  unordered_map<int,_AddrInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_AddrInfo>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  mapped_type *this_01;
  mapped_type *this_02;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> time;
  long lVar5;
  _Base_ptr p_Var6;
  const_iterator __position;
  _Self __tmp;
  Level level;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  Level level_00;
  AddrManImpl *this_03;
  int id_old;
  int id_new;
  string local_78;
  string local_58;
  long local_38;
  key_type *__k;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->mapInfo;
  __position._M_node =
       (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_03 = this;
  do {
    while( true ) {
      if ((_Rb_tree_header *)__position._M_node ==
          &(this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
      id_new = __position._M_node[1]._M_color;
      sVar4 = std::
              _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&this_00->_M_h,&id_new);
      if (sVar4 == 1) break;
LAB_003a1d7c:
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &this->m_tried_collisions,__position);
      __position._M_node = p_Var6;
    }
    this_01 = std::__detail::
              _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&id_new);
    iVar2 = AddrInfo::GetTriedBucket(this_01,&this->nKey,this_03->m_netgroupman);
    uVar3 = AddrInfo::GetBucketPosition(this_01,&this->nKey,false,iVar2);
    bVar1 = CNetAddr::IsValid((CNetAddr *)this_01);
    if (!bVar1) goto LAB_003a1d7c;
    iVar2 = *(int *)((long)this->vvTried[0] + (ulong)uVar3 * 4 + (ulong)(uint)(iVar2 << 8));
    if (iVar2 == -1) {
      time = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>()
      ;
      goto LAB_003a1d77;
    }
    __k = &id_old;
    id_old = iVar2;
    this_02 = std::__detail::
              _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,__k);
    level = (Level)__k;
    time = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    if ((long)time.__d.__r - (this_02->m_last_success).__d.__r < 0x3840) goto LAB_003a1d7c;
    lVar5 = (long)time.__d.__r - (this_02->m_last_try).__d.__r;
    level_00 = (Level)&local_58;
    if (lVar5 < 0x3840) {
      if (0x3c < lVar5) {
        bVar1 = ::LogAcceptCategory(ADDRMAN,level);
        if (bVar1) {
          CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)this_02);
          CService::ToStringAddrPort_abi_cxx11_(&local_78,(CService *)this_01);
          logging_function._M_str = "ResolveCollisions_";
          logging_function._M_len = 0x12;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
          ;
          source_file._M_len = 0x54;
          LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                    (logging_function,source_file,0x3aa,
                     I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|PRUNE|RAND|CMPCTBLOCK|SELECTCOINS|
                     ADDRMAN|ESTIMATEFEE|WALLETDB|HTTP|MEMPOOL|TOR|NET,level_00,(char *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     time.__d.__r,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_03);
LAB_003a1d56:
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_58);
        }
LAB_003a1d77:
        Good_(this_03,(CService *)this_01,false,(NodeSeconds)time.__d.__r);
        goto LAB_003a1d7c;
      }
    }
    else if (0x960 < (long)time.__d.__r - (this_01->m_last_success).__d.__r) {
      bVar1 = ::LogAcceptCategory(ADDRMAN,level);
      if (bVar1) {
        CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)this_02);
        CService::ToStringAddrPort_abi_cxx11_(&local_78,(CService *)this_01);
        logging_function_00._M_str = "ResolveCollisions_";
        logging_function_00._M_len = 0x12;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
        source_file_00._M_len = 0x54;
        LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0x3b4,
                   I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|PRUNE|RAND|CMPCTBLOCK|SELECTCOINS|
                   ADDRMAN|ESTIMATEFEE|WALLETDB|ZMQ|BENCH|MEMPOOL,level_00,(char *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)time.__d.__r
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_03);
        goto LAB_003a1d56;
      }
      goto LAB_003a1d77;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void AddrManImpl::ResolveCollisions_()
{
    AssertLockHeld(cs);

    for (std::set<int>::iterator it = m_tried_collisions.begin(); it != m_tried_collisions.end();) {
        int id_new = *it;

        bool erase_collision = false;

        // If id_new not found in mapInfo remove it from m_tried_collisions
        if (mapInfo.count(id_new) != 1) {
            erase_collision = true;
        } else {
            AddrInfo& info_new = mapInfo[id_new];

            // Which tried bucket to move the entry to.
            int tried_bucket = info_new.GetTriedBucket(nKey, m_netgroupman);
            int tried_bucket_pos = info_new.GetBucketPosition(nKey, false, tried_bucket);
            if (!info_new.IsValid()) { // id_new may no longer map to a valid address
                erase_collision = true;
            } else if (vvTried[tried_bucket][tried_bucket_pos] != -1) { // The position in the tried bucket is not empty

                // Get the to-be-evicted address that is being tested
                int id_old = vvTried[tried_bucket][tried_bucket_pos];
                AddrInfo& info_old = mapInfo[id_old];

                const auto current_time{Now<NodeSeconds>()};

                // Has successfully connected in last X hours
                if (current_time - info_old.m_last_success < ADDRMAN_REPLACEMENT) {
                    erase_collision = true;
                } else if (current_time - info_old.m_last_try < ADDRMAN_REPLACEMENT) { // attempted to connect and failed in last X hours

                    // Give address at least 60 seconds to successfully connect
                    if (current_time - info_old.m_last_try > 60s) {
                        LogDebug(BCLog::ADDRMAN, "Replacing %s with %s in tried table\n", info_old.ToStringAddrPort(), info_new.ToStringAddrPort());

                        // Replaces an existing address already in the tried table with the new address
                        Good_(info_new, false, current_time);
                        erase_collision = true;
                    }
                } else if (current_time - info_new.m_last_success > ADDRMAN_TEST_WINDOW) {
                    // If the collision hasn't resolved in some reasonable amount of time,
                    // just evict the old entry -- we must not be able to
                    // connect to it for some reason.
                    LogDebug(BCLog::ADDRMAN, "Unable to test; replacing %s with %s in tried table anyway\n", info_old.ToStringAddrPort(), info_new.ToStringAddrPort());
                    Good_(info_new, false, current_time);
                    erase_collision = true;
                }
            } else { // Collision is not actually a collision anymore
                Good_(info_new, false, Now<NodeSeconds>());
                erase_collision = true;
            }
        }

        if (erase_collision) {
            m_tried_collisions.erase(it++);
        } else {
            it++;
        }
    }
}